

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heapmanager.h
# Opt level: O3

void __thiscall
Hoard::HeapManager<HL::SpinLockType,_Hoard::HoardHeap<2048,_128>_>::HeapManager
          (HeapManager<HL::SpinLockType,_Hoard::HoardHeap<2048,_128>_> *this)

{
  __int_type _Var1;
  
  HL::HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
  ::HybridHeap((HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
                *)this);
  (this->heapLock)._mutex._M_base._M_i = false;
  LOCK();
  _Var1 = (this->heapLock)._mutex._M_base._M_i;
  (this->heapLock)._mutex._M_base._M_i = true;
  UNLOCK();
  if ((_Var1 & 1U) != 0) {
    HL::SpinLockType::contendedLock(&this->heapLock);
  }
  memset(&(this->super_HoardHeap<2048,_128>).
          super_ANSIWrapper<Hoard::IgnoreInvalidFree<HL::HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>_>_>
          .
          super_IgnoreInvalidFree<HL::HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>_>
          .
          super_HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
          .super_ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>._tidMap,0,0x2200);
  LOCK();
  (this->heapLock)._mutex._M_base._M_i = false;
  UNLOCK();
  return;
}

Assistant:

HeapManager()
    {
      std::lock_guard<LockType> g (heapLock);
      
      /// Initialize all heap maps (nothing yet assigned).
      for (auto i = 0; i < HeapType::MaxThreads; i++) {
	HeapType::setTidMap (i, 0);
      }
      for (auto i = 0; i < HeapType::MaxHeaps; i++) {
	HeapType::setInusemap (i, 0);
      }
    }